

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O1

void __thiscall QAssociativeIterable::removeKey(QAssociativeIterable *this,QVariant *key)

{
  ulong uVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  QMetaAssociation meta;
  QMetaType local_48;
  QMetaContainer local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d_ptr =
       (this->super_QIterable<QMetaAssociation>).m_metaContainer.super_QMetaContainer.d_ptr;
  local_38.shared = (PrivateShared *)0x0;
  local_38._8_8_ = 0;
  local_38._16_8_ = 0;
  local_20 = 2;
  uVar1 = (this->super_QIterable<QMetaAssociation>).m_iterable.m_pointer.d;
  local_48 = QMetaAssociation::keyMetaType((QMetaAssociation *)&local_40);
  pvVar2 = QtPrivate::QVariantTypeCoercer::coerce((QVariantTypeCoercer *)&local_38,key,&local_48);
  if ((local_40.d_ptr != (QMetaContainerInterface *)0x0) &&
     (local_40.d_ptr[1].createIteratorFn != (CreateIteratorFn)0x0)) {
    (*local_40.d_ptr[1].createIteratorFn)
              ((void *)(-(ulong)((uint)uVar1 & 1) & uVar1 & 0xfffffffffffffffe),(Position)pvVar2);
  }
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAssociativeIterable::removeKey(const QVariant &key)
{
    QMetaAssociation meta = metaContainer();
    QtPrivate::QVariantTypeCoercer keyCoercer;
    meta.removeKey(mutableIterable(), keyCoercer.coerce(key, meta.keyMetaType()));
}